

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

void google::CaptureTestOutput(int fd,string *filename)

{
  undefined8 __p;
  ostream *poVar1;
  undefined1 local_7c [100];
  
  local_7c._0_4_ = fd;
  if (fd - 3U < 0xfffffffe) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)(local_7c + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15b);
    poVar1 = LogMessage::stream((LogMessage *)(local_7c + 4));
    std::operator<<(poVar1,"Check failed: (fd == STDOUT_FILENO) || (fd == STDERR_FILENO) ");
  }
  else {
    if (*(long *)(s_captured_streams + (ulong)(uint)fd * 8) == 0) {
      std::make_unique<google::CapturedStream,int&,std::__cxx11::string_const&>
                ((int *)(local_7c + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c);
      __p = local_7c._4_8_;
      local_7c._4_8_ = 0;
      std::__uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
      reset((__uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_> *
            )(s_captured_streams + (long)(int)local_7c._0_4_ * 8),(pointer)__p);
      std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
      ~unique_ptr((unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                   *)(local_7c + 4));
      return;
    }
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)(local_7c + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar1 = LogMessage::stream((LogMessage *)(local_7c + 4));
    std::operator<<(poVar1,"Check failed: s_captured_streams[fd] == nullptr ");
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)(local_7c + 4));
}

Assistant:

static inline void CaptureTestOutput(int fd, const string& filename) {
  CHECK((fd == STDOUT_FILENO) || (fd == STDERR_FILENO));
  CHECK(s_captured_streams[fd] == nullptr);
  s_captured_streams[fd] = std::make_unique<CapturedStream>(fd, filename);
}